

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::isSamplerStateTester(TesterType tester)

{
  undefined1 local_d;
  TesterType tester_local;
  
  local_d = true;
  if (((((tester != TESTER_TEXTURE_WRAP_S) && (local_d = true, tester != TESTER_TEXTURE_WRAP_T)) &&
       (local_d = true, tester != TESTER_TEXTURE_WRAP_R)) &&
      (((local_d = true, tester != TESTER_TEXTURE_MAG_FILTER &&
        (local_d = true, tester != TESTER_TEXTURE_MIN_FILTER)) &&
       ((local_d = true, tester != TESTER_TEXTURE_MIN_LOD &&
        ((local_d = true, tester != TESTER_TEXTURE_MAX_LOD &&
         (local_d = true, tester != TESTER_TEXTURE_COMPARE_MODE)))))))) &&
     ((local_d = true, tester != TESTER_TEXTURE_COMPARE_FUNC &&
      ((((local_d = true, tester != TESTER_TEXTURE_SRGB_DECODE_EXT &&
         (local_d = true, tester != TESTER_TEXTURE_BORDER_COLOR)) &&
        (local_d = true, tester != TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER)) &&
       (local_d = true, tester != TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER)))))) {
    local_d = tester == TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER;
  }
  return local_d;
}

Assistant:

bool isSamplerStateTester (TesterType tester)
{
	return	tester == TESTER_TEXTURE_WRAP_S					||
			tester == TESTER_TEXTURE_WRAP_T					||
			tester == TESTER_TEXTURE_WRAP_R					||
			tester == TESTER_TEXTURE_MAG_FILTER				||
			tester == TESTER_TEXTURE_MIN_FILTER				||
			tester == TESTER_TEXTURE_MIN_LOD				||
			tester == TESTER_TEXTURE_MAX_LOD				||
			tester == TESTER_TEXTURE_COMPARE_MODE			||
			tester == TESTER_TEXTURE_COMPARE_FUNC			||
			tester == TESTER_TEXTURE_SRGB_DECODE_EXT		||
			tester == TESTER_TEXTURE_BORDER_COLOR			||
			tester == TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER	||
			tester == TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER	||
			tester == TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER;
}